

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.cc
# Opt level: O2

void __thiscall
testing::Matcher<std::basic_string_view<char,_std::char_traits<char>_>_>::Matcher
          (Matcher<std::basic_string_view<char,_std::char_traits<char>_>_> *this,StringView s)

{
  allocator<char> local_79;
  MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_> local_78;
  string local_60 [32];
  EqMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_20._M_str = s._M_str;
  local_20._M_len = s._M_len;
  (this->super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>).vtable_ =
       (VTable *)0x0;
  (this->super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>).
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0013f828;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_60,&local_20,&local_79);
  std::__cxx11::string::string((string *)&local_40,local_60);
  Matcher<std::basic_string_view<char,std::char_traits<char>>>::
  Matcher<testing::internal::EqMatcher<std::__cxx11::string>,void>
            ((Matcher<std::basic_string_view<char,std::char_traits<char>>> *)&local_78,&local_40);
  internal::MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>::operator=
            (&this->super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>,
             &local_78);
  internal::MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>::~MatcherBase
            (&local_78);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string(local_60);
  return;
}

Assistant:

Matcher<internal::StringView>::Matcher(internal::StringView s) {
  *this = Eq(std::string(s));
}